

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O0

SstStream SstReaderOpen(char *Name,SstParams Params,SMPI_Comm comm)

{
  char *__ptr;
  int iVar1;
  undefined4 uVar2;
  int iVar3;
  char *__ptr_00;
  CP_Info p_Var4;
  char *pcVar5;
  CP_DP_Interface p_Var6;
  DP_RS_Stream pvVar7;
  FFSTypeHandle Type;
  CP_PeerConnection *pCVar8;
  attr_list p_Var9;
  long lVar10;
  long lVar11;
  SMPI_Comm in_RDX;
  SstParams in_RSI;
  char *in_RDI;
  CMConnection conn;
  attr_list attrs;
  int i_1;
  int result_1;
  _WriterResponseMsg *response;
  int i;
  _ReaderRegisterMsg ReaderRegister;
  _CombinedWriterInfo WriterData;
  char *RequestedDP;
  int result;
  _DPQueryMsg DPQuery;
  attr_list WriterContactAttributes;
  char NeededDataPlane [32];
  void *WriterFileID;
  CMConnection rank0_to_rank0_conn;
  char *Filename;
  timeval Diff;
  timeval Stop;
  timeval Start;
  _ReaderActivateMsg Msg;
  writer_data_t ReturnData;
  void *free_block;
  void *data_block;
  _CP_DP_PairInfo **pointers;
  void *dpInfo;
  SstStream Stream;
  SstStream in_stack_000001d0;
  undefined4 in_stack_fffffffffffffe88;
  uint in_stack_fffffffffffffe8c;
  CP_Info in_stack_fffffffffffffe90;
  undefined8 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  SstStream in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  SstParams in_stack_fffffffffffffeb8;
  SstStream in_stack_fffffffffffffec0;
  void **in_stack_fffffffffffffec8;
  void **RetDataBlock;
  uint uVar12;
  FFSTypeHandle in_stack_fffffffffffffed0;
  _SstParams *in_stack_fffffffffffffed8;
  SstStream in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  SstStream in_stack_fffffffffffffef0;
  SstParams local_e0;
  uint local_d8;
  attr_list local_d0;
  char local_c8 [40];
  SstParams local_a0;
  CMConnection local_98;
  timeval local_78;
  timeval local_68;
  undefined1 local_58 [8];
  int *local_50;
  void *local_48;
  void *local_40;
  void **local_38;
  void *local_30;
  SstStream local_28;
  SMPI_Comm local_20;
  SstParams local_18;
  SstStream local_8;
  
  iVar3 = (int)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  __ptr_00 = strdup(in_RDI);
  local_98 = (CMConnection)0x0;
  memset(local_c8,0,0x20);
  local_28 = CP_newStream();
  local_28->Role = ReaderRole;
  local_28->mpiComm = local_20;
  SMPI_Comm_rank((SMPI_Comm)in_stack_fffffffffffffe90,
                 (int *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  SMPI_Comm_size((SMPI_Comm)in_stack_fffffffffffffe90,
                 (int *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  CP_validateParams(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
  local_28->ConfigParams = local_18;
  p_Var4 = CP_getCPInfo((char *)in_stack_fffffffffffffe90);
  local_28->CPInfo = p_Var4;
  local_28->FinalTimestep = 0x7fffffffffffffff;
  local_28->LastDPNotifiedTimestep = -1;
  gettimeofday(&local_68,(__timezone_ptr_t)0x0);
  local_d0 = ContactWriter(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                           (SstParams)in_stack_fffffffffffffee0,(SMPI_Comm)in_stack_fffffffffffffed8
                           ,(CMConnection *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  if (local_d0 == (attr_list)0x0) {
    SstStreamDestroy(in_stack_000001d0);
    free(local_28);
    free(__ptr_00);
    local_8 = (SstStream)0x0;
  }
  else {
    if (local_28->Rank == 0) {
      memset(&local_e0,0,0x10);
      local_e0 = local_a0;
      local_d8 = CMCondition_get(local_28->CPInfo->SharedCM->cm,local_98);
      CMCondition_set_client_data(local_28->CPInfo->SharedCM->cm,local_d8,local_c8);
      iVar1 = CMwrite(local_98,local_28->CPInfo->SharedCM->DPQueryFormat,&local_e0);
      if (iVar1 != 1) {
        CP_verbose(local_28,CriticalVerbose,
                   "DPQuery message failed to send to writer in SstReaderOpen\n");
      }
      CP_verbose(local_28,PerRankVerbose,
                 "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n",__ptr_00,
                 (ulong)local_d8);
      iVar1 = CMCondition_wait(local_28->CPInfo->SharedCM->cm,local_d8);
      if (iVar1 == 0) {
        fprintf(_stderr,"The writer exited before contact could be made, SST Open failed.\n");
        return (SstStream)0x0;
      }
      CP_verbose(local_28,PerRankVerbose,
                 "finished wait writer DPresponse message in read_open, WRITER is using \"%s\" DataPlane\n"
                 ,local_c8);
      SMPI_Bcast(response,result_1,i_1,attrs._4_4_,(SMPI_Comm)conn);
    }
    else {
      SMPI_Bcast(response,result_1,i_1,attrs._4_4_,(SMPI_Comm)conn);
    }
    __ptr = local_28->ConfigParams->DataTransport;
    pcVar5 = strdup(local_c8);
    local_28->ConfigParams->DataTransport = pcVar5;
    p_Var6 = SelectDP((CP_Services)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                      (_SstParams *)in_stack_fffffffffffffee0,
                      (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_28->DP_Interface = p_Var6;
    if ((local_28->DP_Interface == (CP_DP_Interface)0x0) ||
       (iVar1 = strcmp(local_28->DP_Interface->DPName,local_c8), iVar1 == 0)) {
      if (__ptr != (char *)0x0) {
        free(__ptr);
      }
      FinalizeCPInfo(in_stack_fffffffffffffe90,
                     (CP_DP_Interface)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88))
      ;
      pvVar7 = (*local_28->DP_Interface->initReader)
                         (&Svcs,local_28,&local_30,local_28->ConfigParams,local_d0,&local_28->Stats)
      ;
      local_28->DP_Stream = pvVar7;
      free_attr_list(local_d0);
      local_38 = ParticipateInReaderInitDataExchange
                           (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                            (void **)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      if (local_28->Rank == 0) {
        RetDataBlock = (void **)0x0;
        uVar2 = CMCondition_get(local_28->CPInfo->SharedCM->cm,local_98);
        in_stack_fffffffffffffec0 = (SstStream)CONCAT44(local_28->CohortSize,uVar2);
        in_stack_fffffffffffffe8c = local_28->ConfigParams->SpeculativePreloadMode;
        uVar12 = (uint)((ulong)RetDataBlock >> 0x20);
        if (in_stack_fffffffffffffe8c < 2) {
          RetDataBlock = (void **)CONCAT44(uVar12,local_28->ConfigParams->SpeculativePreloadMode);
        }
        else if ((in_stack_fffffffffffffe8c == 2) &&
                (RetDataBlock = (void **)((ulong)uVar12 << 0x20),
                local_28->CohortSize <= local_28->ConfigParams->SpecAutoNodeThreshold)) {
          RetDataBlock = (void **)CONCAT44(uVar12,1);
        }
        Type = (FFSTypeHandle)malloc((long)local_28->CohortSize << 3);
        in_stack_fffffffffffffed8 =
             (_SstParams *)malloc((long)(int)((ulong)in_stack_fffffffffffffec0 >> 0x20) << 3);
        for (in_stack_fffffffffffffeb4 = 0;
            in_stack_fffffffffffffeb4 < (int)((ulong)in_stack_fffffffffffffec0 >> 0x20);
            in_stack_fffffffffffffeb4 = in_stack_fffffffffffffeb4 + 1) {
          *(undefined8 *)(Type + (long)in_stack_fffffffffffffeb4 * 8) =
               *local_38[in_stack_fffffffffffffeb4];
          (&in_stack_fffffffffffffed8->MarshalMethod)[in_stack_fffffffffffffeb4] =
               *(size_t *)((long)local_38[in_stack_fffffffffffffeb4] + 8);
        }
        free(local_38);
        in_stack_fffffffffffffea8 = (SstStream)0x0;
        CMCondition_set_client_data
                  (local_28->CPInfo->SharedCM->cm,(ulong)in_stack_fffffffffffffec0 & 0xffffffff,
                   &stack0xfffffffffffffea8);
        iVar1 = CMwrite(local_98,local_28->CPInfo->SharedCM->ReaderRegisterFormat,
                        &stack0xfffffffffffffeb8);
        in_stack_fffffffffffffeb8 = local_a0;
        if (iVar1 != 1) {
          CP_verbose(local_28,CriticalVerbose,"Message failed to send to writer in SstReaderOpen\n")
          ;
          in_stack_fffffffffffffeb8 = local_a0;
        }
        free(Type);
        free(in_stack_fffffffffffffed8);
        CP_verbose(local_28,PerRankVerbose,
                   "Waiting for writer response message in SstReadOpen(\"%s\")\n",__ptr_00,
                   (ulong)in_stack_fffffffffffffec0 & 0xffffffff);
        in_stack_fffffffffffffea4 =
             CMCondition_wait(local_28->CPInfo->SharedCM->cm,
                              (ulong)in_stack_fffffffffffffec0 & 0xffffffff);
        if (in_stack_fffffffffffffea4 == 0) {
          fprintf(_stderr,"The writer exited before the SST Reader Open could be completed.\n");
          return (SstStream)0x0;
        }
        CP_verbose(local_28,PerRankVerbose,"finished wait writer response message in read_open\n");
        local_50 = (int *)CP_distributeDataFromRankZero
                                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,Type,
                                     RetDataBlock);
        iVar1 = (int)((ulong)Type >> 0x20);
      }
      else {
        local_50 = (int *)CP_distributeDataFromRankZero
                                    (in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                                     in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
        iVar1 = (int)((ulong)in_stack_fffffffffffffed0 >> 0x20);
      }
      free(local_40);
      if (*local_50 == -1) {
        free(local_48);
        local_8 = (SstStream)0x0;
      }
      else {
        if (local_28->Rank == 0) {
          CP_verbose(local_28,SummaryVerbose,"Opening Reader Stream.\nWriter stream params are:\n");
          CP_dumpParams(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,iVar1);
          CP_verbose(local_28,SummaryVerbose,"Reader stream params are:\n");
          CP_dumpParams(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,iVar1);
        }
        local_28->WriterCohortSize = *local_50;
        local_28->WriterConfigParams = *(_SstParams **)(local_50 + 2);
        if ((local_28->WriterConfigParams->MarshalMethod == 0) && (local_28->Rank == 0)) {
          CP_verbose(local_28,SummaryVerbose,"Writer is doing FFS-based marshalling\n");
        }
        if ((local_28->WriterConfigParams->MarshalMethod == 1) && (local_28->Rank == 0)) {
          CP_verbose(local_28,SummaryVerbose,"Writer is doing BP-based marshalling\n");
        }
        if ((local_28->WriterConfigParams->CPCommPattern == 0) && (local_28->Rank == 0)) {
          CP_verbose(local_28,SummaryVerbose,
                     "Writer is using Minimum Connection Communication pattern (min)\n");
        }
        if ((local_28->WriterConfigParams->CPCommPattern == 1) && (local_28->Rank == 0)) {
          CP_verbose(local_28,SummaryVerbose,
                     "Writer is using Peer-based Communication pattern (peer)\n");
        }
        pthread_mutex_lock((pthread_mutex_t *)&local_28->DataLock);
        local_28->ReaderTimestep = *(long *)(local_50 + 4) + -1;
        if (local_28->WriterConfigParams->CPCommPattern == 1) {
          getPeerArrays(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,iVar3,
                        (int **)in_stack_fffffffffffffe90,
                        (int **)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
          while (iVar3 = HasAllPeers(in_stack_fffffffffffffea8), iVar3 == 0) {
            pthread_cond_wait((pthread_cond_t *)&local_28->DataCondition,
                              (pthread_mutex_t *)&local_28->DataLock);
          }
        }
        else if (local_28->ConnectionsToWriter == (CP_PeerConnection *)0x0) {
          pCVar8 = (CP_PeerConnection *)calloc(0x18,(long)*local_50);
          local_28->ConnectionsToWriter = pCVar8;
        }
        for (iVar3 = 0; iVar3 < *local_50; iVar3 = iVar3 + 1) {
          p_Var9 = (attr_list)
                   attr_list_from_string
                             (**(undefined8 **)(*(long *)(local_50 + 6) + (long)iVar3 * 8));
          local_28->ConnectionsToWriter[iVar3].ContactList = p_Var9;
          local_28->ConnectionsToWriter[iVar3].RemoteStreamID =
               *(void **)(*(long *)(*(long *)(local_50 + 6) + (long)iVar3 * 8) + 8);
        }
        if (local_28->WriterConfigParams->CPCommPattern == 1) {
          if (local_98 != (CMConnection)0x0) {
            CMConnection_dereference(local_98);
          }
        }
        else if (local_98 != (CMConnection)0x0) {
          local_28->ConnectionsToWriter->CMconn = local_98;
          CMconn_register_close_handler(local_98,ReaderConnCloseHandler,local_28);
        }
        local_28->Status = Established;
        gettimeofday(&local_78,(__timezone_ptr_t)0x0);
        lVar10 = local_78.tv_sec - local_68.tv_sec;
        lVar11 = local_78.tv_usec - local_68.tv_usec;
        if (lVar11 < 0) {
          lVar10 = lVar10 + -1;
          lVar11 = lVar11 + 1000000;
        }
        local_28->OpenTimeSecs = (double)lVar11 / 1000000.0 + (double)lVar10;
        gettimeofday((timeval *)&local_28->ValidStartTime,(__timezone_ptr_t)0x0);
        local_28->Filename = __ptr_00;
        local_28->ParamsBlock = local_48;
        pthread_mutex_unlock((pthread_mutex_t *)&local_28->DataLock);
        AddToLastCallFreeList((void *)0x112bde);
        (*local_28->DP_Interface->provideWriterDataToReader)
                  (&Svcs,local_28->DP_Stream,*local_50,local_28->ConnectionsToWriter,
                   *(void ***)(local_50 + 8));
        CP_verbose(local_28,PerRankVerbose,"Sending Reader Activate messages to writer\n");
        memset(local_58,0,8);
        sendOneToEachWriterRank
                  (in_stack_fffffffffffffec0,(CMFormat)in_stack_fffffffffffffeb8,
                   (void *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                   &in_stack_fffffffffffffea8->CPInfo);
        CP_verbose(local_28,PerStepVerbose,
                   "Finish opening Stream \"%s\", starting with Step number %ld\n",__ptr_00,
                   *(undefined8 *)(local_50 + 4));
        local_8 = local_28;
      }
    }
    else {
      fprintf(_stderr,
              "The writer is using the %s DataPlane for SST data transport, but the reader has failed to load this transport.  Communication cannot occur.  See the SST DataTransport engine parameter to force a match."
              ,local_c8);
      local_8 = (SstStream)0x0;
    }
  }
  return local_8;
}

Assistant:

SstStream SstReaderOpen(const char *Name, SstParams Params, SMPI_Comm comm)
{
    SstStream Stream;
    void *dpInfo;
    struct _CP_DP_PairInfo **pointers;
    void *data_block;
    void *free_block;
    writer_data_t ReturnData;
    struct _ReaderActivateMsg Msg;
    struct timeval Start, Stop, Diff;
    char *Filename = strdup(Name);
    CMConnection rank0_to_rank0_conn = NULL;
    void *WriterFileID;
    char NeededDataPlane[32] = {0}; // Don't name a data plane longer than 31 chars

    Stream = CP_newStream();
    Stream->Role = ReaderRole;
    Stream->mpiComm = comm;

    SMPI_Comm_rank(Stream->mpiComm, &Stream->Rank);
    SMPI_Comm_size(Stream->mpiComm, &Stream->CohortSize);

    CP_validateParams(Stream, Params, 0 /* reader */);
    Stream->ConfigParams = Params;

    Stream->CPInfo = CP_getCPInfo(Stream->ConfigParams->ControlModule);

    Stream->FinalTimestep = SSIZE_T_MAX; /* set this on close */
    Stream->LastDPNotifiedTimestep = -1;

    gettimeofday(&Start, NULL);

    attr_list WriterContactAttributes =
        ContactWriter(Stream, Filename, Params, comm, &rank0_to_rank0_conn, &WriterFileID);

    if (WriterContactAttributes == NULL)
    {
        SstStreamDestroy(Stream);
        free(Stream);
        free(Filename);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        struct _DPQueryMsg DPQuery;
        memset(&DPQuery, 0, sizeof(DPQuery));

        DPQuery.WriterFile = WriterFileID;
        DPQuery.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);

        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition,
                                    &NeededDataPlane[0]);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->DPQueryFormat, &DPQuery) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "DPQuery message failed to send to writer in SstReaderOpen\n");
        }

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer DPResponse message in SstReadOpen(\"%s\")\n", Filename,
                   DPQuery.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, DPQuery.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before contact could be made, "
                            "SST Open failed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose,
                   "finished wait writer DPresponse message in read_open, "
                   "WRITER is using \"%s\" DataPlane\n",
                   &NeededDataPlane[0]);

        // NeededDP should now contain the name of the dataplane the writer is
        // using
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    else
    {
        SMPI_Bcast(&NeededDataPlane[0], sizeof(NeededDataPlane), SMPI_CHAR, 0, Stream->mpiComm);
    }
    {
        char *RequestedDP = Stream->ConfigParams->DataTransport;
        Stream->ConfigParams->DataTransport = strdup(&NeededDataPlane[0]);
        Stream->DP_Interface = SelectDP(&Svcs, Stream, Stream->ConfigParams, Stream->Rank);
        if (Stream->DP_Interface)
            if (strcmp(Stream->DP_Interface->DPName, &NeededDataPlane[0]) != 0)
            {
                fprintf(stderr,
                        "The writer is using the %s DataPlane for SST data "
                        "transport, but the reader has failed to load this "
                        "transport.  Communication cannot occur.  See the SST "
                        "DataTransport engine parameter to force a match.",
                        NeededDataPlane);
                return NULL;
            }
        if (RequestedDP)
            free(RequestedDP);
    }

    FinalizeCPInfo(Stream->CPInfo, Stream->DP_Interface);

    Stream->DP_Stream = Stream->DP_Interface->initReader(
        &Svcs, Stream, &dpInfo, Stream->ConfigParams, WriterContactAttributes, &Stream->Stats);

    free_attr_list(WriterContactAttributes);

    pointers =
        (struct _CP_DP_PairInfo **)ParticipateInReaderInitDataExchange(Stream, dpInfo, &data_block);

    if (Stream->Rank == 0)
    {
        struct _CombinedWriterInfo WriterData;
        struct _ReaderRegisterMsg ReaderRegister;

        memset(&ReaderRegister, 0, sizeof(ReaderRegister));
        memset(&WriterData, 0, sizeof(WriterData));
        WriterData.WriterCohortSize = -1;
        ReaderRegister.WriterFile = WriterFileID;
        ReaderRegister.WriterResponseCondition =
            CMCondition_get(Stream->CPInfo->SharedCM->cm, rank0_to_rank0_conn);
        ReaderRegister.ReaderCohortSize = Stream->CohortSize;
        switch (Stream->ConfigParams->SpeculativePreloadMode)
        {
        case SpecPreloadOff:
        case SpecPreloadOn:
            ReaderRegister.SpecPreload =
                (SpeculativePreloadMode)Stream->ConfigParams->SpeculativePreloadMode;
            break;
        case SpecPreloadAuto:
            ReaderRegister.SpecPreload = SpecPreloadOff;
            if (Stream->CohortSize <= Stream->ConfigParams->SpecAutoNodeThreshold)
            {
                ReaderRegister.SpecPreload = SpecPreloadOn;
            }
            break;
        }

        ReaderRegister.CP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        ReaderRegister.DP_ReaderInfo = malloc(ReaderRegister.ReaderCohortSize * sizeof(void *));
        for (int i = 0; i < ReaderRegister.ReaderCohortSize; i++)
        {
            ReaderRegister.CP_ReaderInfo[i] = (CP_ReaderInitInfo)pointers[i]->CP_Info;
            ReaderRegister.DP_ReaderInfo[i] = pointers[i]->DP_Info;
        }
        free(pointers);

        /* the response value is set in the handler */
        volatile struct _WriterResponseMsg *response = NULL;
        CMCondition_set_client_data(Stream->CPInfo->SharedCM->cm,
                                    ReaderRegister.WriterResponseCondition, (void *)&response);

        if (CMwrite(rank0_to_rank0_conn, Stream->CPInfo->SharedCM->ReaderRegisterFormat,
                    &ReaderRegister) != 1)
        {
            CP_verbose(Stream, CriticalVerbose,
                       "Message failed to send to writer in SstReaderOpen\n");
        }
        free(ReaderRegister.CP_ReaderInfo);
        free(ReaderRegister.DP_ReaderInfo);

        /* wait for "go" from writer */
        CP_verbose(Stream, PerRankVerbose,
                   "Waiting for writer response message in SstReadOpen(\"%s\")\n", Filename,
                   ReaderRegister.WriterResponseCondition);
        int result =
            CMCondition_wait(Stream->CPInfo->SharedCM->cm, ReaderRegister.WriterResponseCondition);
        if (result == 0)
        {
            fprintf(stderr, "The writer exited before the SST Reader Open "
                            "could be completed.\n");
            return NULL;
        }
        CP_verbose(Stream, PerRankVerbose, "finished wait writer response message in read_open\n");

        if (response)
        {
            WriterData.WriterCohortSize = response->WriterCohortSize;
            WriterData.WriterConfigParams = response->WriterConfigParams;
            WriterData.StartingStepNumber = response->NextStepNumber;
            WriterData.CP_WriterInfo = response->CP_WriterInfo;
            WriterData.DP_WriterInfo = response->DP_WriterInfo;
        }
        ReturnData = CP_distributeDataFromRankZero(
            Stream, &WriterData, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }
    else
    {
        ReturnData = CP_distributeDataFromRankZero(
            Stream, NULL, Stream->CPInfo->CombinedWriterInfoFormat, &free_block);
    }

    free(data_block);

    if (ReturnData->WriterCohortSize == -1)
    {
        /* Rank 0 found no writer at that contact point, fail the stream */
        free(free_block);
        return NULL;
    }

    if (Stream->Rank == 0)
    {
        CP_verbose(Stream, SummaryVerbose, "Opening Reader Stream.\nWriter stream params are:\n");
        CP_dumpParams(Stream, ReturnData->WriterConfigParams, 0 /* writer side */);
        CP_verbose(Stream, SummaryVerbose, "Reader stream params are:\n");
        CP_dumpParams(Stream, Stream->ConfigParams, 1 /* reader side */);
    }

    //    printf("I am reader rank %d, my info on writers is:\n", Stream->Rank);
    //    FMdump_data(FMFormat_of_original(Stream->CPInfo->combined_writer_Format),
    //                ReturnData, 1024000);
    //    printf("\n");

    Stream->WriterCohortSize = ReturnData->WriterCohortSize;
    Stream->WriterConfigParams = ReturnData->WriterConfigParams;
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalFFS) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing FFS-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->MarshalMethod == SstMarshalBP) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose, "Writer is doing BP-based marshalling\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommMin) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Minimum Connection Communication pattern (min)\n");
    }
    if ((Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer) && (Stream->Rank == 0))
    {
        CP_verbose(Stream, SummaryVerbose,
                   "Writer is using Peer-based Communication pattern (peer)\n");
    }
    STREAM_MUTEX_LOCK(Stream);
    Stream->ReaderTimestep = ReturnData->StartingStepNumber - 1;

    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        /*
         *  Wait for connections and messages from writer side peers
         */
        getPeerArrays(Stream->CohortSize, Stream->Rank, Stream->WriterCohortSize, &Stream->Peers,
                      NULL);

        while (!HasAllPeers(Stream))
        {
            /* wait until we get the timestep metadata or something else changes
             */
            STREAM_CONDITION_WAIT(Stream);
        }
    }
    else
    {
        if (!Stream->ConnectionsToWriter)
        {
            Stream->ConnectionsToWriter =
                calloc(sizeof(CP_PeerConnection), ReturnData->WriterCohortSize);
        }
    }

    for (int i = 0; i < ReturnData->WriterCohortSize; i++)
    {
        attr_list attrs = attr_list_from_string(ReturnData->CP_WriterInfo[i]->ContactInfo);
        Stream->ConnectionsToWriter[i].ContactList = attrs;
        Stream->ConnectionsToWriter[i].RemoteStreamID = ReturnData->CP_WriterInfo[i]->WriterID;
    }

    // Deref the original connection to writer rank 0 (might still be open as a
    // peer)
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        if (rank0_to_rank0_conn)
        {
            CMConnection_dereference(rank0_to_rank0_conn);
        }
    }
    else
    {
        /* only rely on the rank 0 to rank 0 that we already have (if we're rank
         * 0) */
        if (rank0_to_rank0_conn)
        {
            CMConnection conn = rank0_to_rank0_conn;
            Stream->ConnectionsToWriter[0].CMconn = conn;
            CMconn_register_close_handler(conn, ReaderConnCloseHandler, (void *)Stream);
        }
    }
    Stream->Status = Established;
    gettimeofday(&Stop, NULL);
    timersub(&Stop, &Start, &Diff);
    Stream->OpenTimeSecs = (double)Diff.tv_usec / 1e6 + Diff.tv_sec;
    gettimeofday(&Stream->ValidStartTime, NULL);
    Stream->Filename = Filename;
    Stream->ParamsBlock = free_block;
    STREAM_MUTEX_UNLOCK(Stream);
    AddToLastCallFreeList(Stream);
    Stream->DP_Interface->provideWriterDataToReader(
        &Svcs, Stream->DP_Stream, ReturnData->WriterCohortSize, Stream->ConnectionsToWriter,
        ReturnData->DP_WriterInfo);
    CP_verbose(Stream, PerRankVerbose, "Sending Reader Activate messages to writer\n");
    memset(&Msg, 0, sizeof(Msg));
    sendOneToEachWriterRank(Stream, Stream->CPInfo->SharedCM->ReaderActivateFormat, &Msg,
                            &Msg.WSR_Stream);
    CP_verbose(Stream, PerStepVerbose,
               "Finish opening Stream \"%s\", starting with Step number %ld\n", Filename,
               ReturnData->StartingStepNumber);

    return Stream;
}